

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O0

void __thiscall
Keyset::cryptBytes<unsigned_char*,unsigned_char*,void>
          (Keyset *this,uchar *srcFirst,uchar *srcLast,uchar *dstFirst,uint32_t seed)

{
  undefined8 in_RDI;
  Key KVar1;
  Keyset *unaff_retaddr;
  Key c;
  uchar *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  
  KVar1 = computeKey(unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
  std::
  transform<unsigned_char*,unsigned_char*,Keyset::cryptBytes<unsigned_char*,unsigned_char*,void>(unsigned_char*,unsigned_char*,unsigned_char*,unsigned_int)const::_lambda(unsigned_char)_1_>
            ((uchar *)CONCAT44(KVar1._M_elems[0],in_stack_ffffffffffffffc8),&stack0xffffffffffffffcc
             ,in_stack_ffffffffffffffb8,KVar1._M_elems._4_8_);
  return;
}

Assistant:

void cryptBytes(InputIt srcFirst, InputIt srcLast, OutputIt dstFirst, uint32_t seed) const
	{
		typedef typename std::iterator_traits<InputIt>::value_type ValueType;

		auto c = computeKey(seed);

		std::transform(
			srcFirst, srcLast, dstFirst,
			[&c](const ValueType in) {
				const ValueType out = (((c[0] ^ c[1]) ^ in) ^ (c[2] ^ c[3])) & UINT8_C(0xFF);

				c[0] = ((rotateLeft(c[0], 9) & UINT32_C(0x1FE00)) | (c[0] >> 8));
				c[1] = ((rotateLeft(c[1], 11) & UINT32_C(0x7F800)) | (c[1] >> 8));
				c[2] = ((rotateLeft(c[2], 15) & UINT32_C(0x7F8000)) | (c[2] >> 8));
				c[3] = ((rotateLeft(c[3], 21) & UINT32_C(0x1FE00000)) | (c[3] >> 8));

				return out;
			}
		);
	}